

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O2

void vrna_md_defaults_energy_set(int e)

{
  if ((uint)e < 4) {
    defaults.energy_set = e;
    energy_set = e;
    vrna_md_update(&defaults);
    return;
  }
  vrna_message_warning
            (
            "vrna_md_defaults_energy_set@model.c: Energy Set out of range, must be (0 <= e <= 3). Not changing anything!"
            );
  return;
}

Assistant:

PUBLIC void
vrna_md_defaults_energy_set(int e)
{
  if ((e >= 0) && (e <= 3)) {
    defaults.energy_set = e;
#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
    energy_set = e;
#endif
    /* update pair/rtype/alias arrays accordingly */
    vrna_md_update(&defaults);
  } else {
    vrna_message_warning(
      "vrna_md_defaults_energy_set@model.c: Energy Set out of range, must be (0 <= e <= 3). Not changing anything!");
  }
}